

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O1

pair<bool,_bool> __thiscall
spvtools::opt::UpgradeMemoryModel::TraceInstruction
          (UpgradeMemoryModel *this,Instruction *inst,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *visited)

{
  Op OVar1;
  iterator iVar2;
  pointer pOVar3;
  uint **ppuVar4;
  __node_base _Var5;
  bool bVar6;
  char cVar7;
  pair<bool,_bool> pVar8;
  uint32_t uVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  uint **ppuVar12;
  ulong extraout_RDX;
  uint uVar13;
  __hashtable *__h;
  uint uVar14;
  int iVar15;
  pointer pOVar16;
  bool is_coherent;
  bool is_volatile;
  __node_gen_type __node_gen;
  bool local_8a;
  bool local_89;
  key_type local_88;
  __node_base local_60;
  __buckets_ptr local_58;
  size_type sStack_50;
  __node_base local_48;
  code *pcStack_40;
  uint *local_38;
  
  local_88.first = 0;
  local_60._M_nxt = (_Hash_node_base *)visited;
  if (inst->has_result_id_ == true) {
    local_88.first = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88.second,indices);
  iVar10 = std::
           _Hashtable<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_spvtools::opt::CacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(this->cache_)._M_h,&local_88);
  if (local_88.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.second.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.second.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _Var5._M_nxt = local_60._M_nxt;
  if (iVar10.
      super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    uVar9 = 0;
    if (inst->has_result_id_ == true) {
      uVar9 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
    }
    local_58 = (__buckets_ptr)CONCAT44(local_58._4_4_,uVar9);
    local_88._0_8_ = _Var5._M_nxt;
    std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              (_Var5._M_nxt);
    uVar9 = 0;
    pVar8.first = false;
    pVar8.second = false;
    if ((extraout_RDX & 1) != 0) {
      if (inst->has_result_id_ == true) {
        uVar9 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      local_88.first = uVar9;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88.second,indices);
      pmVar11 = std::__detail::
                _Map_base<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_spvtools::opt::CacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_spvtools::opt::CacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->cache_,&local_88);
      if (local_88.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.second.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.second.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.second.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pmVar11->first = false;
      pmVar11->second = false;
      local_8a = false;
      local_89 = false;
      OVar1 = inst->opcode_;
      if ((int)OVar1 < 0x41) {
        if ((OVar1 == OpFunctionParameter) || (OVar1 == OpVariable)) {
          uVar9 = 0;
          bVar6 = HasDecoration(this,inst,0,Coherent);
          local_8a = (bool)(local_8a | bVar6);
          bVar6 = HasDecoration(this,inst,0,DecorationVolatile);
          local_89 = (bool)(local_89 | bVar6);
          if ((local_89 == false) || (local_8a == false)) {
            if (inst->has_type_id_ == true) {
              uVar9 = Instruction::GetSingleWordOperand(inst,0);
            }
            pVar8 = CheckType(this,uVar9,indices);
            local_8a = (bool)(local_8a | pVar8.first);
            local_89 = (bool)(local_89 | pVar8.second);
          }
        }
      }
      else if (OVar1 - OpAccessChain < 2) {
        uVar13 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar13 = (uint)inst->has_result_id_;
        }
        iVar15 = ~uVar13 + (int)((ulong)((long)(inst->operands_).
                                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(inst->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                           -0x55555555;
        if (iVar15 != 0) {
          do {
            uVar13 = (inst->has_result_id_ & 1) + 1;
            if (inst->has_type_id_ == false) {
              uVar13 = (uint)inst->has_result_id_;
            }
            uVar9 = Instruction::GetSingleWordOperand(inst,uVar13 + iVar15);
            local_88.first = uVar9;
            iVar2._M_current =
                 (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(indices,iVar2,&local_88.first);
            }
            else {
              *iVar2._M_current = uVar9;
              (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
      }
      else if (OVar1 == OpPtrAccessChain) {
        uVar13 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar13 = (uint)inst->has_result_id_;
        }
        uVar13 = ~uVar13 + (int)((ulong)((long)(inst->operands_).
                                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(inst->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                           -0x55555555;
        if (1 < uVar13) {
          do {
            uVar14 = (inst->has_result_id_ & 1) + 1;
            if (inst->has_type_id_ == false) {
              uVar14 = (uint)inst->has_result_id_;
            }
            uVar9 = Instruction::GetSingleWordOperand(inst,uVar14 + uVar13);
            local_88.first = uVar9;
            iVar2._M_current =
                 (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(indices,iVar2,&local_88.first);
            }
            else {
              *iVar2._M_current = uVar9;
              (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
        }
      }
      if ((local_8a == true) && (local_89 == true)) {
        pmVar11->first = true;
        pmVar11->second = true;
        pVar8.first = true;
        pVar8.second = true;
      }
      else {
        if ((inst->opcode_ != OpFunctionParameter) && (inst->opcode_ != OpVariable)) {
          local_48._M_nxt = (_Hash_node_base *)0x0;
          pcStack_40 = (code *)0x0;
          local_58 = (__buckets_ptr)0x0;
          sStack_50 = 0;
          local_58 = (__buckets_ptr)operator_new(0x28);
          *local_58 = (__node_base_ptr)this;
          local_58[1] = (__node_base_ptr)&local_8a;
          local_58[2] = (__node_base_ptr)&local_89;
          local_58[3] = (__node_base_ptr)indices;
          local_58[4] = &local_60;
          pcStack_40 = std::
                       _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/upgrade_memory_model.cpp:384:23)>
                       ::_M_invoke;
          local_48._M_nxt =
               (_Hash_node_base *)
               std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/upgrade_memory_model.cpp:384:23)>
               ::_M_manager;
          local_88.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_88._0_8_ = &local_58;
          local_88.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                        ::_M_invoke;
          local_88.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)std::
                        _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                        ::_M_manager;
          pOVar16 = (inst->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pOVar3 = (inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pOVar16 != pOVar3) {
            do {
              bVar6 = spvIsInIdType(pOVar16->type);
              if (bVar6) {
                ppuVar4 = (uint **)(pOVar16->words).large_data_._M_t.
                                   super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                   ._M_head_impl;
                ppuVar12 = &(pOVar16->words).small_data_;
                if (ppuVar4 != (uint **)0x0) {
                  ppuVar12 = ppuVar4;
                }
                local_38 = *ppuVar12;
                if ((code *)local_88.second.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish == (code *)0x0) {
                  std::__throw_bad_function_call();
                }
                cVar7 = (*(code *)local_88.second.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                  (&local_88,&local_38);
                if (cVar7 == '\0') break;
              }
              pOVar16 = pOVar16 + 1;
            } while (pOVar16 != pOVar3);
          }
          if ((code *)local_88.second.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish != (code *)0x0) {
            (*(code *)local_88.second.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish)(&local_88,&local_88,3);
          }
          if (local_48._M_nxt != (_Hash_node_base *)0x0) {
            (*(code *)local_48._M_nxt)(&local_58,&local_58,3);
          }
        }
        pmVar11->first = local_8a;
        pmVar11->second = local_89;
        pVar8.second = local_89;
        pVar8.first = local_8a;
      }
    }
  }
  else {
    pVar8 = *(pair<bool,_bool> *)
             ((long)iVar10.
                    super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_true>
                    ._M_cur + 0x28);
  }
  return pVar8;
}

Assistant:

std::pair<bool, bool> UpgradeMemoryModel::TraceInstruction(
    Instruction* inst, std::vector<uint32_t> indices,
    std::unordered_set<uint32_t>* visited) {
  auto iter = cache_.find(std::make_pair(inst->result_id(), indices));
  if (iter != cache_.end()) {
    return iter->second;
  }

  if (!visited->insert(inst->result_id()).second) {
    return std::make_pair(false, false);
  }

  // Initialize the cache before |indices| is (potentially) modified.
  auto& cached_result = cache_[std::make_pair(inst->result_id(), indices)];
  cached_result.first = false;
  cached_result.second = false;

  bool is_coherent = false;
  bool is_volatile = false;
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpFunctionParameter:
      is_coherent |= HasDecoration(inst, 0, spv::Decoration::Coherent);
      is_volatile |= HasDecoration(inst, 0, spv::Decoration::Volatile);
      if (!is_coherent || !is_volatile) {
        bool type_coherent = false;
        bool type_volatile = false;
        std::tie(type_coherent, type_volatile) =
            CheckType(inst->type_id(), indices);
        is_coherent |= type_coherent;
        is_volatile |= type_volatile;
      }
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
      // Store indices in reverse order.
      for (uint32_t i = inst->NumInOperands() - 1; i > 0; --i) {
        indices.push_back(inst->GetSingleWordInOperand(i));
      }
      break;
    case spv::Op::OpPtrAccessChain:
      // Store indices in reverse order. Skip the |Element| operand.
      for (uint32_t i = inst->NumInOperands() - 1; i > 1; --i) {
        indices.push_back(inst->GetSingleWordInOperand(i));
      }
      break;
    default:
      break;
  }

  // No point searching further.
  if (is_coherent && is_volatile) {
    cached_result.first = true;
    cached_result.second = true;
    return std::make_pair(true, true);
  }

  // Variables and function parameters are sources. Continue searching until we
  // reach them.
  if (inst->opcode() != spv::Op::OpVariable &&
      inst->opcode() != spv::Op::OpFunctionParameter) {
    inst->ForEachInId([this, &is_coherent, &is_volatile, &indices,
                       &visited](const uint32_t* id_ptr) {
      Instruction* op_inst = context()->get_def_use_mgr()->GetDef(*id_ptr);
      const analysis::Type* type =
          context()->get_type_mgr()->GetType(op_inst->type_id());
      if (type &&
          (type->AsPointer() || type->AsImage() || type->AsSampledImage())) {
        bool operand_coherent = false;
        bool operand_volatile = false;
        std::tie(operand_coherent, operand_volatile) =
            TraceInstruction(op_inst, indices, visited);
        is_coherent |= operand_coherent;
        is_volatile |= operand_volatile;
      }
    });
  }

  cached_result.first = is_coherent;
  cached_result.second = is_volatile;
  return std::make_pair(is_coherent, is_volatile);
}